

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O3

void __thiscall
cmRulePlaceholderExpander::ExpandRuleVariables
          (cmRulePlaceholderExpander *this,cmOutputConverter *outputConverter,string *s,
          RuleVariables *replaceValues)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  string var;
  string expandedInput;
  string replace;
  string local_c8;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  cmRulePlaceholderExpander *local_48;
  cmOutputConverter *local_40;
  RuleVariables *local_38;
  
  cVar4 = (char)s;
  local_48 = this;
  local_40 = outputConverter;
  local_38 = replaceValues;
  uVar2 = std::__cxx11::string::find(cVar4,0x3c);
  if (uVar2 != 0xffffffffffffffff) {
    local_a8 = &local_98;
    local_a0 = 0;
    local_98 = 0;
    do {
      if (s->_M_string_length - 2 <= uVar2) break;
      lVar3 = std::__cxx11::string::find(cVar4,0x3e);
      if (lVar3 == -1) goto LAB_002d6e95;
      iVar1 = isalpha((int)(s->_M_dataplus)._M_p[uVar2 + 1]);
      if (iVar1 == 0) {
        uVar2 = std::__cxx11::string::find(cVar4,0x3c);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)s);
        ExpandRuleVariable(&local_68,local_48,local_40,&local_c8,local_38);
        std::__cxx11::string::substr((ulong)local_88,(ulong)s);
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88[0]);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
        uVar2 = std::__cxx11::string::find(cVar4,0x3c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
    } while (uVar2 != 0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)s);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)s);
LAB_002d6e95:
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
  }
  return;
}

Assistant:

void cmRulePlaceholderExpander::ExpandRuleVariables(
  cmOutputConverter* outputConverter, std::string& s,
  const RuleVariables& replaceValues)
{
  std::string::size_type start = s.find('<');
  // no variables to expand
  if (start == std::string::npos) {
    return;
  }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while (start != std::string::npos && start < s.size() - 2) {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if (end == std::string::npos) {
      return;
    }
    char c = s[start + 1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if (!isalpha(c)) {
      start = s.find('<', start + 1);
    } else {
      // extract the var
      std::string var = s.substr(start + 1, end - start - 1);
      std::string replace =
        this->ExpandRuleVariable(outputConverter, var, replaceValues);
      expandedInput += s.substr(pos, start - pos);
      expandedInput += replace;
      // move to next one
      start = s.find('<', start + var.size() + 2);
      pos = end + 1;
    }
  }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size() - pos);
  s = expandedInput;
}